

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cComputeShaderTests.cpp
# Opt level: O2

bool __thiscall
glcts::anon_unknown_0::BasicSharedSimple::RunIteration
          (BasicSharedSimple *this,GLuint num_groups,bool dispatch_indirect)

{
  CallLogWrapper *pCVar1;
  uint uVar2;
  void *pvVar3;
  GLuint GVar4;
  ulong __n;
  bool bVar5;
  GLuint i;
  ulong uVar6;
  allocator_type local_61;
  CallLogWrapper *local_60;
  GLuint groups [3];
  vector<unsigned_int,_std::allocator<unsigned_int>_> data;
  
  __n = (ulong)(num_groups << 7);
  groups[0] = 0xffff;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&data,__n,groups,&local_61);
  local_60 = (CallLogWrapper *)&this->m_storage_buffer;
  GVar4 = this->m_storage_buffer;
  if (GVar4 == 0) {
    glu::CallLogWrapper::glGenBuffers
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,1,(GLuint *)local_60);
    GVar4 = *(GLuint *)local_60;
  }
  pCVar1 = &(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glBindBufferBase(pCVar1,0x90d2,0,GVar4);
  glu::CallLogWrapper::glBufferData
            (pCVar1,0x90d2,__n * 4,
             data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start,0x88e8);
  glu::CallLogWrapper::glBindBuffer(pCVar1,0x90d2,0);
  glu::CallLogWrapper::glUseProgram(pCVar1,this->m_program);
  if (dispatch_indirect) {
    groups._4_8_ = &DAT_100000001;
    GVar4 = this->m_dispatch_buffer;
    groups[0] = num_groups;
    if (GVar4 == 0) {
      glu::CallLogWrapper::glGenBuffers(pCVar1,1,&this->m_dispatch_buffer);
      GVar4 = this->m_dispatch_buffer;
    }
    glu::CallLogWrapper::glBindBuffer(pCVar1,0x90ee,GVar4);
    glu::CallLogWrapper::glBufferData(pCVar1,0x90ee,0xc,groups,0x88e4);
    glu::CallLogWrapper::glDispatchComputeIndirect(pCVar1,0);
  }
  else {
    glu::CallLogWrapper::glDispatchCompute(pCVar1,num_groups,1,1);
  }
  glu::CallLogWrapper::glBindBuffer(pCVar1,0x90d2,*(GLuint *)local_60);
  glu::CallLogWrapper::glMemoryBarrier(pCVar1,0x200);
  local_60 = pCVar1;
  pvVar3 = glu::CallLogWrapper::glMapBufferRange(pCVar1,0x90d2,0,__n * 4,1);
  bVar5 = true;
  for (uVar6 = 0; pCVar1 = local_60, __n != uVar6; uVar6 = uVar6 + 1) {
    uVar2 = *(uint *)((long)pvVar3 + uVar6 * 4);
    if (uVar2 != 1) {
      bVar5 = false;
      anon_unknown_0::Output
                ("Data at index %d is %d should be %d.\n",uVar6 & 0xffffffff,(ulong)uVar2,1);
    }
  }
  glu::CallLogWrapper::glUnmapBuffer(local_60,0x90d2);
  glu::CallLogWrapper::glBindBuffer(pCVar1,0x90d2,0);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  return bVar5;
}

Assistant:

bool RunIteration(const GLuint num_groups, bool dispatch_indirect)
	{
		const GLuint kBufferSize = 128 * num_groups;

		std::vector<GLuint> data(kBufferSize, 0xffff);
		if (m_storage_buffer == 0)
			glGenBuffers(1, &m_storage_buffer);
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_storage_buffer);
		glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(GLuint) * kBufferSize, &data[0], GL_DYNAMIC_DRAW);
		glBindBuffer(GL_SHADER_STORAGE_BUFFER, 0);

		glUseProgram(m_program);
		if (dispatch_indirect)
		{
			const GLuint groups[3] = { num_groups, 1, 1 };
			if (m_dispatch_buffer == 0)
				glGenBuffers(1, &m_dispatch_buffer);
			glBindBuffer(GL_DISPATCH_INDIRECT_BUFFER, m_dispatch_buffer);
			glBufferData(GL_DISPATCH_INDIRECT_BUFFER, sizeof(groups), groups, GL_STATIC_DRAW);
			glDispatchComputeIndirect(0);
		}
		else
		{
			glDispatchCompute(num_groups, 1, 1);
		}

		glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_storage_buffer);
		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);
		GLuint* result;
		result = static_cast<GLuint*>(
			glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, sizeof(GLuint) * kBufferSize, GL_MAP_READ_BIT));
		bool res = true;
		for (GLuint i = 0; i < kBufferSize; ++i)
		{
			if (result[i] != 1)
			{
				Output("Data at index %d is %d should be %d.\n", i, result[i], 1);
				res = false;
			}
		}
		glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);
		glBindBuffer(GL_SHADER_STORAGE_BUFFER, 0);
		return res;
	}